

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.hpp
# Opt level: O0

string * __thiscall OpenMD::SC::getName_abi_cxx11_(SC *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 8));
  return in_RDI;
}

Assistant:

virtual string getName() { return name_; }